

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardrtn.c
# Opt level: O3

int slowreturn(void)

{
  short sVar1;
  ushort uVar2;
  FX *frame68k;
  DLword *pDVar3;
  uint uVar4;
  DLword DVar5;
  DLword *pDVar6;
  DLword DVar7;
  short *psVar8;
  ulong uVar9;
  DLword *pDVar10;
  
  DVar5 = (DLword)*(int *)(MachineState.pvar + -10);
  uVar4 = *(int *)(MachineState.pvar + -10) - 0xb;
  uVar9 = (ulong)(ushort)uVar4;
  if ((uVar4 & 1) != 0) {
    printf("Misaligned StackOffset in NativeAligned4FromStackOffset 0x%hx\n",uVar9);
    DVar5 = MachineState.pvar[-10];
  }
  frame68k = (FX *)(Stackspace + uVar9);
  DVar7 = MachineState.pvar[-2];
  if ((DVar5 & 0xfffe) != DVar7) {
    if ((MachineState.pvar[-10] & 1) == 0) {
      pDVar3 = MachineState.pvar + -0xc;
      if (((ulong)pDVar3 & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",pDVar3);
      }
      MachineState.pvar[-1] = (DLword)((uint)((int)pDVar3 - (int)Lisp_world) >> 1);
      MachineState.pvar[-2] = MachineState.pvar[-10];
      DVar7 = MachineState.pvar[-2];
    }
    MachineState.pvar[-10] = DVar7 + 0xb;
    decusecount68k(frame68k);
    uVar4 = *(int *)(MachineState.pvar + -2) - 10U & 0xffff;
    if ((*(int *)(MachineState.pvar + -2) - 10U & 1) != 0) {
      printf("Misaligned StackOffset in NativeAligned4FromStackOffset 0x%hx\n",(ulong)uVar4);
    }
    frame68k = (FX *)(Stackspace + uVar4);
  }
  if (frame68k->field_0x2 == '\0') goto LAB_00125ad5;
  MachineState.csp = MachineState.csp + 2;
  uVar9 = (long)MachineState.csp - (long)Stackspace >> 1;
  if (0xffff < uVar9) {
    printf("Stack offset is out of range: 0x%tx\n",uVar9);
  }
  MachineState.pvar[-5] = (DLword)uVar9;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xa000;
  *(short *)((ulong)(MachineState.csp + 1) ^ 2) =
       (short)((uint)((int)MachineState.endofstack - (int)MachineState.csp) >> 1);
  if (*(short *)((ulong)(MachineState.csp + 1) ^ 2) == 0) {
    error("0-long free block.");
  }
  frame68k = make_FXcopy(frame68k);
  if (frame68k == (FX *)0x0) {
    return 1;
  }
  pDVar10 = (DLword *)((ulong)((uint)MachineState.pvar[-5] * 2) + (long)Stackspace);
  pDVar3 = pDVar10;
  if (*(short *)((ulong)pDVar10 ^ 2) == -0x6000) goto LAB_00125aa0;
  error("pre_moveframe: MP9316");
  sVar1 = *(short *)((ulong)pDVar10 ^ 2);
  while (sVar1 == -0x6000) {
LAB_00125aa0:
    pDVar3 = pDVar3 + *(ushort *)((ulong)(pDVar3 + 1) ^ 2);
    MachineState.endofstack = pDVar3;
    sVar1 = *(short *)((ulong)pDVar3 ^ 2);
  }
  while( true ) {
    MachineState.csp = pDVar10 + -2;
LAB_00125ad5:
    pDVar3 = Stackspace + frame68k->nextblock;
    uVar2 = MachineState.pvar[-1];
    if ((uVar2 & 1) != 0) {
      printf("Misaligned StackOffset in NativeAligned4FromStackOffset 0x%hx\n",(ulong)(uint)uVar2);
    }
    pDVar10 = Stackspace + (uint)uVar2;
    psVar8 = (short *)((ulong)pDVar3 ^ 2);
    if (*psVar8 == -0x6000) break;
    if (pDVar3 == MachineState.ivar) {
      if ((char)pDVar10[1] == '\0') break;
      MachineState.csp = MachineState.csp + 2;
      uVar9 = (long)MachineState.csp - (long)Stackspace >> 1;
      if (0xffff < uVar9) {
        printf("Stack offset is out of range: 0x%tx\n",uVar9);
      }
      MachineState.pvar[-5] = (DLword)uVar9;
      *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xa000;
      *(short *)((ulong)(MachineState.csp + 1) ^ 2) =
           (short)((uint)((int)MachineState.endofstack - (int)MachineState.csp) >> 1);
      if (*(short *)((ulong)(MachineState.csp + 1) ^ 2) == 0) {
        error("0-long free block.");
      }
      frame68k = make_FXcopy(frame68k);
      if (frame68k == (FX *)0x0) {
        return 1;
      }
      pDVar10 = (DLword *)((ulong)((uint)MachineState.pvar[-5] * 2) + (long)Stackspace);
      pDVar3 = pDVar10;
      if (*(short *)((ulong)pDVar10 ^ 2) == -0x6000) goto LAB_00125ce4;
      error("pre_moveframe: MP9316");
      sVar1 = *(short *)((ulong)pDVar10 ^ 2);
      while (sVar1 == -0x6000) {
LAB_00125ce4:
        pDVar3 = pDVar3 + *(ushort *)((ulong)(pDVar3 + 1) ^ 2);
        MachineState.endofstack = pDVar3;
        sVar1 = *(short *)((ulong)pDVar3 ^ 2);
      }
    }
    else {
      MachineState.csp = MachineState.csp + 2;
      uVar9 = (long)MachineState.csp - (long)Stackspace >> 1;
      if (0xffff < uVar9) {
        printf("Stack offset is out of range: 0x%tx\n",uVar9);
      }
      MachineState.pvar[-5] = (DLword)uVar9;
      *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xa000;
      *(short *)((ulong)(MachineState.csp + 1) ^ 2) =
           (short)((uint)((int)MachineState.endofstack - (int)MachineState.csp) >> 1);
      if (*(short *)((ulong)(MachineState.csp + 1) ^ 2) == 0) {
        error("0-long free block.");
      }
      frame68k = make_FXcopy(frame68k);
      if (frame68k == (FX *)0x0) {
        return 1;
      }
      pDVar10 = (DLword *)((ulong)((uint)MachineState.pvar[-5] * 2) + (long)Stackspace);
      pDVar3 = pDVar10;
      if (*(short *)((ulong)pDVar10 ^ 2) == -0x6000) goto LAB_00125bed;
      error("pre_moveframe: MP9316");
      sVar1 = *(short *)((ulong)pDVar10 ^ 2);
      while (sVar1 == -0x6000) {
LAB_00125bed:
        pDVar3 = pDVar3 + *(ushort *)((ulong)(pDVar3 + 1) ^ 2);
        MachineState.endofstack = pDVar3;
        sVar1 = *(short *)((ulong)pDVar3 ^ 2);
      }
    }
  }
  pDVar6 = MachineState.ivar;
  if ((*MachineState.pvar & 0x2000000) != 0) {
    pDVar6 = MachineState.pvar + -0xc;
    uVar2 = pDVar10[1];
    if ((char)uVar2 == '\0') {
      *(undefined2 *)((ulong)MachineState.ivar ^ 2) = 0xa000;
      *(short *)((ulong)(MachineState.ivar + 1) ^ 2) =
           (short)((uint)((int)pDVar10 - (int)MachineState.ivar) >> 1) + 2;
      if (*(short *)((ulong)(MachineState.ivar + 1) ^ 2) == 0) {
        error("creating 0-len block");
      }
    }
    else {
      pDVar10[1] = uVar2 & 0xff00 | uVar2 - 1 & 0xff;
    }
  }
  *(undefined2 *)((ulong)pDVar6 ^ 2) = 0xa000;
  uVar4 = (int)MachineState.endofstack - (int)pDVar6;
  *(short *)((ulong)(pDVar6 + 1) ^ 2) = (short)(uVar4 >> 1);
  if ((uVar4 & 0x1fffe) == 0) {
    error("creating 0-len block");
  }
  MachineState.pvar = &frame68k[1].alink;
  pDVar10 = pDVar3;
  if (*psVar8 == -0x6000) goto LAB_00125dd6;
  error("OP_return: MP9316");
  sVar1 = *psVar8;
  while (sVar1 == -0x6000) {
LAB_00125dd6:
    pDVar10 = pDVar10 + *(ushort *)((ulong)(pDVar10 + 1) ^ 2);
    MachineState.endofstack = pDVar10;
    sVar1 = *(short *)((ulong)pDVar10 ^ 2);
  }
  uVar2 = MachineState.pvar[-9];
  if ((uVar2 >> 10 & 1) == 0) {
    if ((uVar2 >> 8 & 1) == 0) {
      MachineState.csp = pDVar3 + -2;
    }
    else {
      MachineState.pvar[-9] = uVar2 & 0xfaff;
      MachineState.tosvalue = *(LispPTR *)(pDVar3 + -2);
      MachineState.csp = pDVar3 + -4;
    }
    MachineState.ivar =
         (DLword *)
         ((ulong)((uint)*(ushort *)((ulong)(MachineState.pvar + -0xb) ^ 2) * 2) + (long)Stackspace);
    uVar4 = *(uint *)(MachineState.pvar + -8);
    if ((uVar4 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar4);
    }
    MachineState.currentfunc =
         (fnhead *)((ulong)uVar4 * 2 + CONCAT44(Lisp_world._4_4_,(int)Lisp_world));
    MachineState.currentpc =
         (ByteCode *)((long)&(MachineState.currentfunc)->na + (ulong)MachineState.pvar[-6]);
  }
  else {
    error("Stack error: INCALL bit found in returnee frame");
    error("Control reached end of slowreturn()!");
  }
  return 0;
}

Assistant:

int slowreturn(void) {
  DLword *next68k;
  DLword *freeptr;
  Bframe *currentBF;
  FX *returnFX;

  S_CHECK(SLOWP(CURRENTFX), "CURRENTFX not SLOWP");

  /* Get returnee's FX from CURRENTFX->alink , It's SLOWP case */
  returnFX = (FX *)NativeAligned4FromStackOffset(CURRENTFX->alink - 11);

  if ((CURRENTFX->alink & 0xFFFE) != CURRENTFX->clink) { /* ALINK != CLINK */
#ifdef STACKCHECK
    printf("A!=C\n");
#endif
    /* return to CLINK fx */
    SETALINK(CURRENTFX, CURRENTFX->clink);
    decusecount68k(returnFX);
    returnFX = (FX *)NativeAligned4FromStackOffset(CURRENTFX->clink - FRAMESIZE);
  }

  if (returnFX->usecount != 0) { /* COPY returnee's FX */
#ifdef STACKCHECK
    printf("returnFX->usecount !=0\n");
#endif
    MAKE_FXCOPY(returnFX); /* smashes returnFX */
  }

retry: /* this is retry entry after MAKE_FXCOPY etc */

  next68k = NativeAligned2FromStackOffset(returnFX->nextblock);
  currentBF = (Bframe *)NativeAligned4FromStackOffset(CURRENTFX->blink);

  if (GETWORD(next68k) == STK_FSB_WORD) {
  another:
    freeptr = ((DLword *)CURRENTFX) - 2;
    if (BFRAMEPTR(freeptr)->residual) {
      if (BFRAMEPTR(currentBF)->usecnt == 0) {
        /* make FREEBLOCK for real BF */
        GETWORD(IVar) = STK_FSB_WORD;
        GETWORD(IVar + 1) = (((UNSIGNED)currentBF - (UNSIGNED)IVar) >> 1) + 2;
        if (0 == GETWORD(IVar + 1)) error("creating 0-len block");
      } else
        BFRAMEPTR(currentBF)->usecnt--;
    } else
      freeptr = IVar; /* reset free ptr: not residual case */

    /* free FX + BF(dummy or real) */
    GETWORD(freeptr) = STK_FSB_WORD;
    GETWORD(freeptr + 1) = ((UNSIGNED)EndSTKP - (UNSIGNED)freeptr) >> 1;
    if (0 == GETWORD(freeptr + 1)) error("creating 0-len block");
    S_CHECK(EndSTKP >= freeptr, "EndSTKP < freeptr!");
    S_CHECK(FSB_size(freeptr) >= MINEXTRASTACKWORDS,
            "free block < min size, after deciding it fits.");

    PVar = ((DLword *)returnFX) + FRAMESIZE;
    /*  Now right CURRENTFX(PVar) is set */

    if (GETWORD(next68k) != STK_FSB_WORD) error("OP_return: MP9316");

    freeptr = next68k;
    while (GETWORD(freeptr) == STK_FSB_WORD) EndSTKP = freeptr = freeptr + GETWORD(freeptr + 1);

    if (CURRENTFX->incall) { /* this frame is  Interrupted */
      error("Stack error: INCALL bit found in returnee frame");
    } else {
      if (CURRENTFX->nopush) {
        CURRENTFX->nopush = NIL;
        CurrentStackPTR = next68k - 2;
        TopOfStack = *((LispPTR *)CurrentStackPTR);
        CurrentStackPTR -= 2;

      } else
        CurrentStackPTR = next68k - 2;

      S_CHECK(EndSTKP >= freeptr, "EndSTKP < freeptr");

      FastRetCALL;
#ifdef LISPTRACE
      printf("TRACE: return from ");
      print(fnobj->framename);
      printf(" :<= ");
      print(TopOfStack);
      printf("\n");
#endif
      return (0); /* normal return */
    }

  } /* FSB end */
  else if (next68k != IVar) {
#ifdef STACKCHECK
    printf("next68k != IVar and not FSB\n");
#endif
    MAKE_FXCOPY(returnFX); /* smashes returnFX */
    goto retry;
  } else if (BFRAMEPTR(currentBF)->usecnt != 0) {
#ifdef STACKCHECK
    printf("currentBF->usecnt != 0");
#endif
    MAKE_FXCOPY(returnFX); /* smashes returnFX */
    goto retry;
  } else {
    if ((next68k == IVar) || (BFRAMEPTR(currentBF)->usecnt == 0))
      goto another;
    else
      error("Shouldn't");
  }
  error("Control reached end of slowreturn()!");
  return (NIL); /* NOT REACHED */
}